

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O1

bool __thiscall
Minisat::OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>
          (OnlineProofChecker *this,vec<Minisat::Lit> *cls)

{
  long lVar1;
  long *plVar2;
  ulong *puVar3;
  int iVar4;
  Lit *pLVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  
  if (3 < *(int *)(this + 0xf8)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] remove clause ",0x1c);
    if (0 < cls->sz) {
      lVar9 = 0;
      do {
        uVar6 = cls->data[lVar9].x;
        uVar11 = (int)uVar6 >> 1;
        uVar15 = ~uVar11;
        if ((uVar6 & 1) == 0) {
          uVar15 = uVar11 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar15);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        lVar9 = lVar9 + 1;
      } while (lVar9 < cls->sz);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    printState(this);
  }
  if ((cls->sz == 0) || (*this != (OnlineProofChecker)0x1)) {
LAB_0010a6df:
    bVar21 = true;
  }
  else if (cls->sz == 1) {
    uVar7 = (ulong)*(int *)(this + 0x38);
    bVar21 = 0 < (long)uVar7;
    if (0 < (long)uVar7) {
      lVar9 = *(long *)(this + 0x30);
      uVar8 = 0;
      do {
        if (*(int *)(lVar9 + uVar8 * 4) == cls->data->x) {
          *(undefined4 *)(lVar9 + uVar8 * 4) = *(undefined4 *)(lVar9 + -4 + uVar7 * 4);
          *(int *)(this + 0x38) = *(int *)(this + 0x38) + -1;
          if (1 < *(int *)(this + 0xf8)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ",0x1d);
            if (0 < cls->sz) {
              lVar9 = 0;
              do {
                uVar6 = cls->data[lVar9].x;
                uVar11 = (int)uVar6 >> 1;
                uVar15 = ~uVar11;
                if ((uVar6 & 1) == 0) {
                  uVar15 = uVar11 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar15);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                lVar9 = lVar9 + 1;
              } while (lVar9 < cls->sz);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
            std::ostream::put(' ');
            std::ostream::flush();
          }
          goto LAB_0010a6df;
        }
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
      bVar21 = uVar8 < uVar7;
    }
  }
  else {
    if (0x3fffffff < *(uint *)(this + 0xa8)) {
      memset(*(void **)(this + 0x90),0,*(long *)(this + 0x98) - (long)*(void **)(this + 0x90));
      *(undefined4 *)(this + 0xa8) = 0;
    }
    iVar4 = *(int *)(this + 0xa8);
    *(int *)(this + 0xa8) = iVar4 + 1;
    pLVar5 = cls->data;
    lVar9 = *(long *)(this + 0x90);
    *(int *)(lVar9 + (ulong)(uint)pLVar5->x * 4) = iVar4 + 1;
    uVar6 = 0;
    if (1 < cls->sz) {
      lVar13 = *(long *)(this + 0x40);
      lVar14 = 1;
      uVar15 = 0;
      do {
        *(undefined4 *)(lVar9 + (ulong)(uint)pLVar5[lVar14].x * 4) = *(undefined4 *)(this + 0xa8);
        uVar6 = (uint)lVar14;
        if ((ulong)(*(long *)(lVar13 + 8 + (long)(int)uVar15 * 0x18) -
                   *(long *)(lVar13 + (long)(int)uVar15 * 0x18)) <=
            (ulong)(*(long *)(lVar13 + 8 + (long)pLVar5[lVar14].x * 0x18) -
                   *(long *)(lVar13 + (long)pLVar5[lVar14].x * 0x18))) {
          uVar6 = uVar15;
        }
        lVar14 = lVar14 + 1;
        uVar15 = uVar6;
      } while (lVar14 < cls->sz);
    }
    iVar4 = pLVar5[(int)uVar6].x;
    plVar2 = (long *)(*(long *)(this + 0x40) + (long)iVar4 * 0x18);
    lVar13 = *plVar2;
    lVar14 = plVar2[1];
    lVar20 = lVar14 - lVar13;
    if (lVar20 == 0) {
      uVar8 = 0;
      uVar7 = 0xffffffff;
    }
    else {
      lVar16 = *(long *)(this + 8);
      uVar7 = 0xffffffff;
      uVar8 = 0;
      do {
        uVar19 = (ulong)*(uint *)(lVar13 + uVar8 * 4);
        uVar10 = *(ulong *)(lVar16 + uVar19 * 4);
        bVar21 = true;
        if (cls->sz == (uint)(uVar10 >> 0x22)) {
          bVar22 = 0x3ffffffff < uVar10;
          if (0x3ffffffff < uVar10) {
            if (*(int *)(lVar9 + (ulong)*(uint *)(lVar16 + 8 + uVar19 * 4) * 4) ==
                *(int *)(this + 0xa8)) {
              uVar18 = 0;
              do {
                if ((uVar10 >> 0x22) - 1 == uVar18) goto LAB_0010a173;
                lVar1 = uVar18 * 4;
                uVar18 = uVar18 + 1;
              } while (*(int *)(lVar9 + (ulong)*(uint *)(lVar16 + 0xc + uVar19 * 4 + lVar1) * 4) ==
                       *(int *)(this + 0xa8));
              bVar22 = uVar18 < uVar10 >> 0x22;
            }
            if (bVar22) goto LAB_0010a192;
          }
LAB_0010a173:
          *(undefined4 *)(lVar13 + uVar8 * 4) = *(undefined4 *)(lVar13 + -4 + lVar20);
          lVar14 = lVar14 + -4;
          plVar2[1] = lVar14;
          uVar8 = 0xffffffffffffffff;
          bVar21 = false;
          uVar7 = uVar19;
        }
LAB_0010a192:
        if (!bVar21) break;
        uVar8 = uVar8 + 1;
        lVar20 = lVar14 - lVar13;
      } while (uVar8 < (ulong)(lVar20 >> 2));
    }
    bVar22 = uVar8 != plVar2[1] - lVar13 >> 2;
    iVar17 = (int)uVar7;
    bVar21 = iVar17 != -1 && bVar22;
    if (iVar17 != -1 && bVar22) {
      if (0 < cls->sz) {
        uVar8 = 0;
        do {
          if (uVar8 != uVar6) {
            plVar2 = (long *)(*(long *)(this + 0x40) + (long)cls->data[uVar8].x * 0x18);
            lVar9 = *plVar2;
            lVar13 = plVar2[1];
            lVar14 = lVar13 - lVar9;
            if (lVar14 == 0) {
              lVar20 = 0;
            }
            else {
              lVar20 = (lVar14 >> 2) + (ulong)(lVar14 >> 2 == 0);
              lVar16 = 0;
              do {
                if (*(int *)(lVar9 + lVar16 * 4) == iVar17) {
                  *(undefined4 *)(lVar9 + lVar16 * 4) = *(undefined4 *)(lVar9 + -4 + lVar14);
                  plVar2[1] = lVar13 + -4;
                  lVar20 = -1;
                  break;
                }
                lVar16 = lVar16 + 1;
              } while (lVar20 != lVar16);
            }
            if (lVar20 == plVar2[1] - lVar9 >> 2) {
              if (1 < *(int *)(this + 0xf8)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c could not remove clause ",0x1a);
                if (0 < cls->sz) {
                  lVar9 = 0;
                  do {
                    uVar15 = cls->data[lVar9].x;
                    uVar12 = (int)uVar15 >> 1;
                    uVar11 = ~uVar12;
                    if ((uVar15 & 1) == 0) {
                      uVar11 = uVar12 + 1;
                    }
                    std::ostream::operator<<((ostream *)&std::cerr,uVar11);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < cls->sz);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr," from list of literal ",0x16);
                uVar15 = cls->data[uVar8].x;
                uVar12 = (int)uVar15 >> 1;
                uVar11 = ~uVar12;
                if ((uVar15 & 1) == 0) {
                  uVar11 = uVar12 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar11);
                std::ostream::flush();
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
                std::ostream::put(' ');
                std::ostream::flush();
              }
              printState(this);
              if (2 < *(int *)(this + 0xf8)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c list for ",0xb);
                uVar15 = cls->data[uVar8].x;
                uVar12 = (int)uVar15 >> 1;
                uVar11 = ~uVar12;
                if ((uVar15 & 1) == 0) {
                  uVar11 = uVar12 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar11);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," : ",3);
                if (plVar2[1] != *plVar2) {
                  uVar10 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"c ",2)
                    ;
                    uVar19 = (ulong)*(uint *)(*plVar2 + uVar10 * 4);
                    if (0x3ffffffff < *(ulong *)(*(long *)(this + 8) + uVar19 * 4)) {
                      puVar3 = (ulong *)(*(long *)(this + 8) + uVar19 * 4);
                      uVar19 = 0;
                      do {
                        uVar15 = *(uint *)((long)puVar3 + uVar19 * 4 + 8);
                        uVar12 = (int)uVar15 >> 1;
                        uVar11 = ~uVar12;
                        if ((uVar15 & 1) == 0) {
                          uVar11 = uVar12 + 1;
                        }
                        std::ostream::operator<<((ostream *)&std::cerr,uVar11);
                        std::ostream::flush();
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr," ",1);
                        uVar19 = uVar19 + 1;
                      } while (uVar19 < *puVar3 >> 0x22);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
                    std::ostream::put(' ');
                    std::ostream::flush();
                    uVar10 = uVar10 + 1;
                  } while (uVar10 < (ulong)(plVar2[1] - *plVar2 >> 2));
                }
              }
            }
          }
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < (long)cls->sz);
      }
      lVar9 = *(long *)(this + 8);
      lVar13 = ((long)*(int *)(lVar9 + 8 + uVar7 * 4) ^ 1U) * 0x10;
      plVar2 = (long *)(*(long *)(this + 0x58) + lVar13);
      uVar6 = *(uint *)(*(long *)(this + 0x58) + 8 + lVar13);
      if ((long)(int)uVar6 < 1) {
        uVar8 = 0;
      }
      else {
        uVar10 = 0;
        do {
          uVar8 = uVar10;
          if (*(int *)(*plVar2 + uVar10 * 8) == iVar17) break;
          uVar10 = uVar10 + 1;
          uVar8 = (ulong)uVar6;
        } while (uVar6 != uVar10);
        uVar8 = uVar8 & 0xffffffff;
      }
      *(undefined8 *)(*plVar2 + uVar8 * 8) = *(undefined8 *)(*plVar2 + -8 + (long)(int)uVar6 * 8);
      *(int *)(plVar2 + 1) = (int)plVar2[1] + -1;
      lVar9 = ((long)*(int *)(lVar9 + 0xc + uVar7 * 4) ^ 1U) * 0x10;
      plVar2 = (long *)(*(long *)(this + 0x58) + lVar9);
      uVar6 = *(uint *)(*(long *)(this + 0x58) + 8 + lVar9);
      if ((long)(int)uVar6 < 1) {
        uVar8 = 0;
      }
      else {
        uVar10 = 0;
        do {
          uVar8 = uVar10;
          if (*(int *)(*plVar2 + uVar10 * 8) == iVar17) break;
          uVar10 = uVar10 + 1;
          uVar8 = (ulong)uVar6;
        } while (uVar6 != uVar10);
        uVar8 = uVar8 & 0xffffffff;
      }
      *(undefined8 *)(*plVar2 + uVar8 * 8) = *(undefined8 *)(*plVar2 + -8 + (long)(int)uVar6 * 8);
      *(int *)(plVar2 + 1) = (int)plVar2[1] + -1;
      *(ulong *)(*(long *)(this + 8) + uVar7 * 4) =
           (*(ulong *)(*(long *)(this + 8) + uVar7 * 4) & 0xfffffffffffffffc) + 1;
      uVar8 = *(ulong *)(*(long *)(this + 8) + uVar7 * 4);
      uVar6 = 2;
      if ((uVar8 & 4) == 0) {
        uVar6 = (uint)(uVar8 >> 3) & 1;
      }
      *(uint *)(this + 0x18) = (uint)(uVar8 >> 0x22) + *(int *)(this + 0x18) + uVar6 + 2;
      if (1 < *(int *)(this + 0xf8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ",0x1d);
        if (0 < cls->sz) {
          lVar9 = 0;
          do {
            uVar6 = cls->data[lVar9].x;
            uVar11 = (int)uVar6 >> 1;
            uVar15 = ~uVar11;
            if ((uVar6 & 1) == 0) {
              uVar15 = uVar11 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar15);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            lVar9 = lVar9 + 1;
          } while (lVar9 < cls->sz);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," which is internally ",0x15);
        if (0x3ffffffff < *(ulong *)(*(long *)(this + 8) + uVar7 * 4)) {
          puVar3 = (ulong *)(*(long *)(this + 8) + uVar7 * 4);
          uVar7 = 0;
          do {
            uVar6 = *(uint *)((long)puVar3 + uVar7 * 4 + 8);
            uVar11 = (int)uVar6 >> 1;
            uVar15 = ~uVar11;
            if ((uVar6 & 1) == 0) {
              uVar15 = uVar11 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar15);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            uVar7 = uVar7 + 1;
          } while (uVar7 < *puVar3 >> 0x22);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
      }
    }
    else {
      if (1 < *(int *)(this + 0xf8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] could not remove clause ",0x26);
        if (0 < cls->sz) {
          lVar9 = 0;
          do {
            uVar6 = cls->data[lVar9].x;
            uVar11 = (int)uVar6 >> 1;
            uVar15 = ~uVar11;
            if ((uVar6 & 1) == 0) {
              uVar15 = uVar11 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar15);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            lVar9 = lVar9 + 1;
          } while (lVar9 < cls->sz);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," from list of literal ",0x16);
        uVar6 = ~(iVar4 >> 1);
        if (((long)iVar4 & 1U) == 0) {
          uVar6 = (iVar4 >> 1) + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar6);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
      }
      printState(this);
    }
  }
  return bVar21;
}

Assistant:

inline bool OnlineProofChecker::removeClause(const T &cls)
{
    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] remove clause " << cls << std::endl;
        printState();
    }

    if (cls.size() == 0 || !ok) {
        return true;
    } // do not handle empty clauses here!
    if (cls.size() == 1) {
        const Lit l = cls[0];
        int i = 0;
        bool found = false;
        for (; i < unitClauses.size(); ++i) {
            if (unitClauses[i] == l) {
                unitClauses[i] = unitClauses[unitClauses.size() - 1];
                unitClauses.pop();
                found = true;
                break; // remove only once!
            }
        }
        if (!found) {
            assert(false && "the unit clause should be inside the vector of units");
            return false;
        }
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] removed clause " << cls << std::endl;
        }
        return true;
    }
    // find correct CRef ...
    ma.nextStep();
    int smallestIndex = 0;
    ma.setCurrentStep(toInt(cls[0]));
    for (int i = 1; i < cls.size(); ++i) {
        ma.setCurrentStep(toInt(cls[i]));
        if (occ[toInt(cls[i])].size() < occ[smallestIndex].size()) {
            smallestIndex = i;
        }
    }

    const Lit smallest = cls[smallestIndex];

    CRef ref = CRef_Undef;
    size_t i = 0;
    for (; i < occ[toInt(smallest)].size(); ++i) {
        const Clause &c = ca[occ[toInt(smallest)][i]];
        if (c.size() != cls.size()) {
            continue;
        } // do not check this clause!

        int hit = 0;
        for (; hit < c.size(); ++hit) {
            if (!ma.isCurrentStep(toInt(c[hit]))) {
                break;
            } // a literal is not in both clauses, not the correct clause
        }
        if (hit < c.size()) {
            continue;
        } // not the right clause -> check next!

        ref = occ[toInt(smallest)][i];
        // remove from this occ-list
        occ[toInt(smallest)][i] = occ[toInt(smallest)][occ[toInt(smallest)].size() - 1];
        occ[toInt(smallest)].pop_back();
        i = ~0; // set to indicate that we found the clause
        break;
    }
    if (i == occ[toInt(smallest)].size() || ref == CRef_Undef) {
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] could not remove clause " << cls << " from list of literal " << smallest << std::endl;
        }
        printState();
        assert(false && "clause should be in the data structures");
        return false;
    }

    // remove from the other occ-lists!
    for (int i = 0; i < cls.size(); ++i) {
        if (i == smallestIndex) {
            continue;
        }
        std::vector<CRef> &list = occ[toInt(cls[i])];
        size_t j = 0;
        for (; j < list.size(); ++j) {
            if (list[j] == ref) {
                list[j] = list[list.size() - 1];
                list.pop_back(); // remove the element
                j = -1;          // point somewhere invalid
                break;
            }
        }
        if (j == list.size()) {
            if (verbose > 1) {
                std::cerr << "c could not remove clause " << cls << " from list of literal " << cls[i] << std::endl;
            }
            printState();
            if (verbose > 2) {
                std::cerr << "c list for " << cls[i] << " : ";
                for (size_t k = 0; k < list.size(); ++k) {
                    std::cerr << "c " << ca[list[k]] << std::endl;
                }
            }
            assert(false && "should be able to remove the clause from all lists");
        }
    }

    // remove the clause from the two watched literal structures!
    detachClause(ref);

    // tell the garbage-collection-system that the clause can be removed
    ca[ref].mark(1);
    ca.free(ref);

    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] removed clause " << cls << " which is internally " << ca[ref] << std::endl;
    }
    // check garbage collection once in a while!
    // TODO
    return true;
}